

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O3

FT_Error FT_Stream_OpenLZW(FT_Stream stream,FT_Stream source)

{
  FT_Memory memory;
  int iVar1;
  FT_Error FVar2;
  undefined8 *P;
  int local_34;
  
  iVar1 = 0x28;
  if (source != (FT_Stream)0x0 && stream != (FT_Stream)0x0) {
    memory = source->memory;
    iVar1 = ft_lzw_check_header(source);
    if (iVar1 == 0) {
      stream->close = (FT_Stream_CloseFunc)0x0;
      stream->memory = (FT_Memory)0x0;
      stream->cursor = (uchar *)0x0;
      stream->limit = (uchar *)0x0;
      (stream->pathname).value = 0;
      stream->read = (FT_Stream_IoFunc)0x0;
      stream->pos = 0;
      (stream->descriptor).value = 0;
      stream->base = (uchar *)0x0;
      stream->size = 0;
      stream->memory = memory;
      local_34 = iVar1;
      P = (undefined8 *)ft_mem_qalloc(memory,0x1108,&local_34);
      iVar1 = local_34;
      if (local_34 == 0) {
        P[1] = stream;
        *P = source;
        P[2] = stream->memory;
        P[0x220] = P + 0x21e;
        P[0x21f] = P + 0x21e;
        P[0x21e] = 0;
        FVar2 = ft_lzw_check_header(source);
        if (FVar2 != 0) {
          local_34 = FVar2;
          ft_mem_free(memory,P);
          return local_34;
        }
        memset(P + 3,0,0xd8);
        P[0x1c] = source;
        P[0x1d] = source->memory;
        P[0xe] = 0;
        P[0xf] = 0;
        *(undefined4 *)(P + 0x10) = 0;
        P[0x11] = P + 0x14;
        P[0x13] = 0x40;
        *(undefined1 *)(P + 7) = 0;
        P[6] = 0;
        *(undefined4 *)((long)P + 0x54) = 9;
        (stream->descriptor).pointer = P;
      }
      stream->size = 0x7fffffff;
      stream->pos = 0;
      stream->base = (uchar *)0x0;
      stream->read = ft_lzw_stream_io;
      stream->close = ft_lzw_stream_close;
    }
  }
  return iVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stream_OpenLZW( FT_Stream  stream,
                     FT_Stream  source )
  {
    FT_Error    error;
    FT_Memory   memory;
    FT_LZWFile  zip = NULL;


    if ( !stream || !source )
    {
      error = FT_THROW( Invalid_Stream_Handle );
      goto Exit;
    }

    memory = source->memory;

    /*
     * Check the header right now; this prevents allocation of a huge
     * LZWFile object (400 KByte of heap memory) if not necessary.
     *
     * Did I mention that you should never use .Z compressed font
     * files?
     */
    error = ft_lzw_check_header( source );
    if ( error )
      goto Exit;

    FT_ZERO( stream );
    stream->memory = memory;

    if ( !FT_QNEW( zip ) )
    {
      error = ft_lzw_file_init( zip, stream, source );
      if ( error )
      {
        FT_FREE( zip );
        goto Exit;
      }

      stream->descriptor.pointer = zip;
    }

    stream->size  = 0x7FFFFFFFL;  /* don't know the real size! */
    stream->pos   = 0;
    stream->base  = NULL;
    stream->read  = ft_lzw_stream_io;
    stream->close = ft_lzw_stream_close;

  Exit:
    return error;
  }